

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O3

void __thiscall
blockencodings_tests::NonCoinbasePreforwardRTTest::test_method(NonCoinbasePreforwardRTTest *this)

{
  _Atomic_word *p_Var1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  assertion_result *paVar2;
  CTxMemPool *this_01;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  element_type *peVar5;
  __pthread_internal_list *p_Var6;
  _Base_ptr p_Var7;
  undefined8 uVar8;
  bool bVar9;
  ReadStatus RVar10;
  int iVar11;
  unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *puVar12;
  long lVar13;
  uint64_t uVar14;
  CTransaction *__tmp;
  size_t *psVar15;
  size_t *psVar16;
  char *pcVar17;
  vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *this_03;
  iterator in_R9;
  iterator pvVar18;
  iterator pvVar19;
  CheckBlockFn *pCVar20;
  CheckBlockFn *__x;
  pointer psVar21;
  _Base_ptr p_Var22;
  __pthread_internal_list *p_Var23;
  long in_FS_OFFSET;
  readonly_property<bool> rVar24;
  byte bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  check_type cVar28;
  undefined1 *local_940;
  undefined1 *local_938;
  char *local_930;
  char *local_928;
  undefined1 *local_920;
  undefined1 *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  char *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  undefined1 local_890 [48];
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  undefined1 *local_840;
  undefined1 local_838 [8];
  char *local_830 [2];
  char *local_820 [2];
  undefined1 *local_810;
  header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
  local_808;
  char *local_800;
  char *local_7f8;
  bool mutated;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  char *local_7a0;
  undefined1 *local_798;
  undefined1 *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  undefined1 *local_768;
  undefined1 *local_760;
  char *local_758;
  pointer local_750;
  char *local_748;
  char *local_740;
  undefined1 *local_738;
  _Base_ptr local_730;
  char *local_728;
  _Base_ptr local_720;
  char *local_718;
  char *local_710;
  undefined1 *local_708;
  _Base_ptr local_700;
  char *local_6f8;
  _Base_ptr local_6f0;
  char *local_6e8;
  char *local_6e0;
  undefined1 *local_6d8;
  _Base_ptr local_6d0;
  char *local_6c8;
  _Base_ptr local_6c0;
  undefined1 local_6b8 [32];
  CFeeRate local_698;
  CFeeRate local_690;
  char *local_688;
  _Optional_payload_base<unsigned_int> local_680;
  TestMemPoolEntryHelper entry;
  string *local_630;
  undefined1 local_628 [16];
  undefined1 local_618 [8];
  shared_ptr<boost::basic_wrap_stringstream<char>_> local_610;
  undefined1 local_600 [8];
  assertion_result local_5f8;
  string **local_5e0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined1 local_5b8 [16];
  shared_count asStack_5a8 [2];
  undefined1 local_598 [16];
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  undefined1 local_558 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_548;
  undefined1 local_538 [48];
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [40];
  PartiallyDownloadedBlock partialBlockCopy;
  undefined1 local_418 [16];
  shared_count sStack_408;
  _Base_ptr p_Stack_400;
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [32];
  CBlockHeaderAndShortTxIDs shortIDs2;
  TestHeaderAndShortIDs shortIDs;
  uint256 txhash;
  PartiallyDownloadedBlock partialBlock;
  CBlock block;
  FastRandomContext rand_ctx;
  assertion_result local_58;
  _Base_ptr local_40;
  long local_38;
  
  local_538._8_8_ = local_538._0_8_;
  local_6b8._8_8_ = local_6b8._0_8_;
  txhash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       txhash.super_base_blob<256U>.m_data._M_elems._0_8_;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish =
       shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start;
  bVar25 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar17 = "m_node.mempool";
  puVar12 = inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
                      (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.
                        super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
                       ,0x94,"test_method","m_node.mempool");
  this_01 = (puVar12->_M_t).super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
            .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl;
  entry.nFee = 0;
  entry.time.__d.__r = (duration)0x0;
  entry.nHeight = 1;
  entry.m_sequence = 0;
  entry.spendsCoinbase = false;
  entry.sigOpCost = 4;
  entry.lp.height = 0;
  entry.lp.time = 0;
  entry.lp.maxInputBlock = (CBlockIndex *)0x0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  partialBlock.prefilled_count = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x2a;
  FastRandomContext::FastRandomContext(&rand_ctx,(uint256 *)&partialBlock);
  BuildBlockTestCase(&block,&rand_ctx);
  criticalblock1.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock1.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock1.super_unique_lock);
  criticalblock2.super_unique_lock._M_device = &(this_01->cs).super_recursive_mutex;
  criticalblock2.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock2.super_unique_lock);
  TestMemPoolEntryHelper::FromTx
            ((CTxMemPoolEntry *)&partialBlock,&entry,
             block.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 2);
  CTxMemPool::addUnchecked(this_01,(CTxMemPoolEntry *)&partialBlock);
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)(partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 4));
  std::
  _Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
  ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_CTxMemPoolEntry>,_std::reference_wrapper<const_CTxMemPoolEntry>,_std::_Identity<std::reference_wrapper<const_CTxMemPoolEntry>_>,_CompareIteratorByHash,_std::allocator<std::reference_wrapper<const_CTxMemPoolEntry>_>_>
               *)&partialBlock.txn_available.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(partialBlock.txn_available.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish._1_7_,
               partialBlock.txn_available.
               super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               ._M_impl.super__Vector_impl_data._M_finish._0_1_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(partialBlock.txn_available.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                        partialBlock.txn_available.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish._0_1_));
  }
  local_688 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_680 = (_Optional_payload_base<unsigned_int>)
              ((long)
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
              + 0x6d);
  local_698.nSatoshisPerK = (CAmount)&boost::unit_test::basic_cstring<char_const>::null;
  local_690.nSatoshisPerK = (CAmount)&boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x9b;
  file.m_begin = (iterator)&local_688;
  msg.m_end = in_R9;
  msg.m_begin = pcVar17;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_698,msg);
  shortIDs2.shorttxidk1._0_1_ = 0;
  shortIDs2.shorttxidk0 = (uint64_t)&PTR__lazy_ostream_01388f08;
  shortIDs2.nonce = (uint64_t)boost::unit_test::lazy_ostream::inst;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf4aea1;
  CTxMemPool::get((CTxMemPool *)local_538,(uint256 *)this_01);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    lVar13 = 0;
  }
  else {
    lVar13 = (long)*(_Atomic_word *)(local_538._8_8_ + 8);
  }
  local_58._0_8_ = &txhash;
  txhash.super_base_blob<256U>.m_data._M_elems[0] = (char)lVar13;
  txhash.super_base_blob<256U>.m_data._M_elems[1] = (char)((ulong)lVar13 >> 8);
  txhash.super_base_blob<256U>.m_data._M_elems[2] = (char)((ulong)lVar13 >> 0x10);
  txhash.super_base_blob<256U>.m_data._M_elems[3] = (char)((ulong)lVar13 >> 0x18);
  txhash.super_base_blob<256U>.m_data._M_elems[4] = (char)((ulong)lVar13 >> 0x20);
  txhash.super_base_blob<256U>.m_data._M_elems[5] = (char)((ulong)lVar13 >> 0x28);
  txhash.super_base_blob<256U>.m_data._M_elems[6] = (char)((ulong)lVar13 >> 0x30);
  txhash.super_base_blob<256U>.m_data._M_elems[7] = (char)((ulong)lVar13 >> 0x38);
  local_6b8._0_8_ = 4;
  shortIDs.header.nVersion._0_1_ = lVar13 == 4;
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_418[0] = (class_property<bool>)0xe3;
  local_418._1_7_ = 0xe406;
  local_418[8] = 0x50;
  local_418._9_7_ = 0xe407;
  partialBlock.prefilled_count = (size_t)&local_58;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0xa8;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0x13892;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0x139d1;
  partialBlockCopy.prefilled_count = (size_t)(local_600 + 8);
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB81(local_6b8,0);
  local_5f8._1_7_ = SUB87((ulong)local_6b8 >> 8,0);
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013892a8;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  pvVar18 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&shortIDs,(lazy_ostream *)&shortIDs2,1,2,REQUIRE,0xe40780,
             (size_t)local_418,0x9b,(CTxMemPoolEntry *)&partialBlock,"SHARED_TX_OFFSET + 0",
             &partialBlockCopy);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._8_8_);
  }
  txhash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  txhash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  TestHeaderAndShortIDs::TestHeaderAndShortIDs(&shortIDs,&block,&rand_ctx);
  this_03 = &shortIDs.prefilledtxn;
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::resize(this_03,1);
  peVar3 = block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  (shortIDs.prefilledtxn.
   super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
   super__Vector_impl_data._M_start)->index = 1;
  ((shortIDs.prefilledtxn.
    super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
    super__Vector_impl_data._M_start)->tx).
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  this_02 = ((shortIDs.prefilledtxn.
              super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>.
              _M_impl.super__Vector_impl_data._M_start)->tx).
            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  ((shortIDs.prefilledtxn.
    super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
    super__Vector_impl_data._M_start)->tx).
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4;
  if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
  }
  this_00 = &shortIDs.shorttxids;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,2);
  uVar14 = TestHeaderAndShortIDs::GetShortID
                     (&shortIDs,
                      &(((block.vtx.
                          super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->m_witness_hash);
  *shortIDs.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
   super__Vector_impl_data._M_start = uVar14;
  uVar14 = TestHeaderAndShortIDs::GetShortID
                     (&shortIDs,
                      &(block.vtx.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[2].
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       m_witness_hash);
  shortIDs.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[1] = uVar14;
  local_6b8._16_16_ = (undefined1  [16])0x0;
  local_6b8._0_16_ = (undefined1  [16])0x0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = SUB81(this_00,0);
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = (undefined7)((ulong)this_00 >> 8);
  SerializeMany<DataStream,CBlockHeader,unsigned_long,Wrapper<VectorFormatter<CustomUintFormatter<6,false>>,std::vector<unsigned_long,std::allocator<unsigned_long>>const&>,std::vector<PrefilledTransaction,std::allocator<PrefilledTransaction>>>
            ((DataStream *)local_6b8,&shortIDs.header,&shortIDs.nonce,
             (Wrapper<VectorFormatter<CustomUintFormatter<6,_false>_>,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>
              *)&partialBlock,this_03);
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  shortIDs2.header.nTime = 0;
  shortIDs2.header.nBits = 0;
  shortIDs2.header.nNonce = 0;
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  shortIDs2.header.nVersion = 0;
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CBlockHeaderAndShortTxIDs::
  SerializationOps<DataStream,CBlockHeaderAndShortTxIDs,ActionUnserialize>(&shortIDs2,local_6b8);
  partialBlock.mempool_count = 0;
  partialBlock.extra_count = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  partialBlock.prefilled_count = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  partialBlock.header.nVersion = 0;
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  partialBlock.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  partialBlock.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  partialBlock.header.nTime = 0;
  partialBlock.header.nBits = 0;
  partialBlock.header.nNonce = 0;
  partialBlock.m_check_block_mock.super__Function_base._M_functor = (_Any_data)0x0;
  partialBlock.m_check_block_mock.super__Function_base._M_manager = (_Manager_type)0x0;
  partialBlock.m_check_block_mock._M_invoker = (_Invoker_type)0x0;
  local_6c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6c0 = (_Base_ptr)0xe40750;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d0 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xaf;
  file_00.m_begin = (iterator)&local_6c8;
  msg_00.m_end = pvVar18;
  msg_00.m_begin = (iterator)this_03;
  partialBlock.pool = this_01;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_6d8,
             msg_00);
  _cVar28 = 0x2d65c7;
  RVar10 = PartiallyDownloadedBlock::InitData(&partialBlock,&shortIDs2,&empty_extra_txn);
  local_418[0] = (class_property<bool>)(RVar10 == READ_STATUS_OK);
  local_418[8] = _S_red;
  local_418._9_7_ = 0;
  sStack_408.pi_ = (sp_counted_base *)0x0;
  local_538._0_8_ = "partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK";
  local_538._8_8_ =
       (long)"partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK" + 0x43;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_6e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6e0 = "";
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x0;
  partialBlockCopy.prefilled_count = (size_t)local_538;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_418,(lazy_ostream *)&partialBlockCopy,1,0,WARN,_cVar28,
             (size_t)&local_6e8,0xaf);
  boost::detail::shared_count::~shared_count(&sStack_408);
  local_6f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_6f0 = (_Base_ptr)0xe40750;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  local_700 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xb0;
  file_01.m_begin = (iterator)&local_6f8;
  msg_01.m_end = pvVar19;
  msg_01.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_708,
             msg_01);
  _cVar28 = 0x2d66a7;
  bVar9 = PartiallyDownloadedBlock::IsTxAvailable(&partialBlock,0);
  local_418[0] = (class_property<bool>)!bVar9;
  local_418[8] = _S_red;
  local_418._9_7_ = 0;
  sStack_408.pi_ = (sp_counted_base *)0x0;
  local_538._0_8_ = "!partialBlock.IsTxAvailable(0)";
  local_538._8_8_ = (long)"!partialBlock.IsTxAvailable(0)" + 0x1e;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_718 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_710 = "";
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x0;
  partialBlockCopy.prefilled_count = (size_t)local_538;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_418,(lazy_ostream *)&partialBlockCopy,1,0,WARN,_cVar28,
             (size_t)&local_718,0xb0);
  boost::detail::shared_count::~shared_count(&sStack_408);
  local_728 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_720 = (_Base_ptr)0xe40750;
  local_738 = &boost::unit_test::basic_cstring<char_const>::null;
  local_730 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xb1;
  file_02.m_begin = (iterator)&local_728;
  msg_02.m_end = pvVar19;
  msg_02.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_738,
             msg_02);
  _cVar28 = 0x2d6789;
  local_418[0] = (class_property<bool>)PartiallyDownloadedBlock::IsTxAvailable(&partialBlock,1);
  local_418[8] = _S_red;
  local_418._9_7_ = 0;
  sStack_408.pi_ = (sp_counted_base *)0x0;
  local_538._0_8_ = (long)"!partialBlock.IsTxAvailable(1)" + 1;
  local_538._8_8_ = (long)"!partialBlock.IsTxAvailable(1)" + 0x1e;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_748 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_740 = "";
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x0;
  partialBlockCopy.prefilled_count = (size_t)local_538;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_418,(lazy_ostream *)&partialBlockCopy,1,0,WARN,_cVar28,
             (size_t)&local_748,0xb1);
  boost::detail::shared_count::~shared_count(&sStack_408);
  local_758 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_750 = (pointer)0xe40750;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xb2;
  file_03.m_begin = (iterator)&local_758;
  msg_03.m_end = pvVar19;
  msg_03.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_768,
             msg_03);
  _cVar28 = 0x2d6869;
  local_418[0] = (class_property<bool>)PartiallyDownloadedBlock::IsTxAvailable(&partialBlock,2);
  local_418[8] = _S_red;
  local_418._9_7_ = 0;
  sStack_408.pi_ = (sp_counted_base *)0x0;
  local_538._8_8_ = "";
  local_538._0_8_ = "partialBlock.IsTxAvailable(2)";
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_01389048;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_778 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_770 = "";
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x0;
  partialBlockCopy.prefilled_count = (size_t)local_538;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_418,(lazy_ostream *)&partialBlockCopy,1,0,WARN,_cVar28,
             (size_t)&local_778,0xb2);
  boost::detail::shared_count::~shared_count(&sStack_408);
  local_788 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_780 = "";
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xb4;
  file_04.m_begin = (iterator)&local_788;
  msg_04.m_end = pvVar19;
  msg_04.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_798,
             msg_04);
  local_538[8] = 0;
  local_538._0_8_ = &PTR__lazy_ostream_01388f08;
  local_538._24_8_ = (__pthread_internal_list *)0xf4aea1;
  local_538._16_8_ = boost::unit_test::lazy_ostream::inst;
  CTxMemPool::get((CTxMemPool *)local_890,(uint256 *)this_01);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_890._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_598._0_8_ = (pointer)0x0;
  }
  else {
    local_598._0_8_ = SEXT48(*(_Atomic_word *)(local_890._8_8_ + 8));
  }
  local_558._0_8_ = local_598;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)((pointer)local_598._0_8_ == (pointer)0x5);
  local_578._0_8_ = local_5b8;
  local_5b8._0_8_ = (pointer)0x5;
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xe3;
  local_5f8._1_7_ = 0xe406;
  local_5f8.m_message.px._0_1_ = 'P';
  local_5f8.m_message.px._1_7_ = 0xe407;
  partialBlockCopy.prefilled_count = (size_t)local_558;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013892a8;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_418[8] = _S_red;
  local_418[0] = (class_property<bool>)0xa8;
  local_418._1_7_ = 0x13892;
  sStack_408.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x2;
  p_Stack_400 = (_Base_ptr)local_578;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_538,1,2,REQUIRE,0xe40780,(size_t)(local_600 + 8),0xb4,
             &partialBlockCopy,"SHARED_TX_OFFSET + 1",(assertion_result *)local_418);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_890._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_890._8_8_);
  }
  local_3c8._16_11_ = SUB1611((undefined1  [16])0x0,5);
  local_3c8._0_8_ = (_Base_ptr)0x0;
  local_3c8._8_3_ = 0;
  local_3c8._11_5_ = 0;
  local_3d8 = (undefined1  [16])0x0;
  local_3e8 = (undefined1  [16])0x0;
  local_3f8 = (undefined1  [16])0x0;
  sStack_408.pi_ = (sp_counted_base *)0x0;
  p_Stack_400 = (_Base_ptr)0x0;
  local_418[0] = (class_property<bool>)0x0;
  local_418._1_7_ = 0;
  local_418[8] = _S_red;
  local_418._9_7_ = 0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&partialBlockCopy.txn_available,&partialBlock.txn_available);
  psVar15 = &partialBlock.prefilled_count;
  psVar16 = &partialBlockCopy.prefilled_count;
  for (lVar13 = 0xe; lVar13 != 0; lVar13 = lVar13 + -1) {
    *psVar16 = *psVar15;
    psVar15 = psVar15 + (ulong)bVar25 * -2 + 1;
    psVar16 = psVar16 + (ulong)bVar25 * -2 + 1;
  }
  pCVar20 = &partialBlockCopy.m_check_block_mock;
  __x = &partialBlock.m_check_block_mock;
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  function(pCVar20,__x);
  local_7a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7a0 = "";
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xb9;
  file_05.m_begin = (iterator)&local_7a8;
  msg_05.m_end = pvVar19;
  msg_05.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_7b8,
             msg_05);
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_5f8._1_7_ = 0;
  local_5f8.m_message.px._0_1_ = '\0';
  local_5f8.m_message.px._1_7_ = 0;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  _cVar28 = 0x2d6baa;
  RVar10 = PartiallyDownloadedBlock::FillBlock
                     (&partialBlock,(CBlock *)local_418,
                      (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)(local_600 + 8));
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(RVar10 == READ_STATUS_INVALID);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_890._0_8_ = "partialBlock.FillBlock(block2, {}) == READ_STATUS_INVALID";
  local_890._8_8_ = "";
  local_538[8] = 0;
  local_538._0_8_ = &PTR__lazy_ostream_01389048;
  local_538._24_8_ = (__pthread_internal_list *)local_890;
  local_538._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_7c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7c0 = "";
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_538,1,0,WARN,_cVar28,(size_t)&local_7c8,0xb9);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)(local_600 + 8));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator=(&partialBlock.txn_available,&partialBlockCopy.txn_available);
  psVar15 = &partialBlockCopy.prefilled_count;
  psVar16 = &partialBlock.prefilled_count;
  for (lVar13 = 0xe; lVar13 != 0; lVar13 = lVar13 + -1) {
    *psVar16 = *psVar15;
    psVar15 = psVar15 + (ulong)bVar25 * -2 + 1;
    psVar16 = psVar16 + (ulong)bVar25 * -2 + 1;
  }
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  operator=(__x,pCVar20);
  if (partialBlockCopy.m_check_block_mock.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*partialBlockCopy.m_check_block_mock.super__Function_base._M_manager)
              ((_Any_data *)pCVar20,(_Any_data *)pCVar20,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&partialBlockCopy.txn_available);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&partialBlockCopy.txn_available,&partialBlock.txn_available);
  psVar15 = &partialBlock.prefilled_count;
  psVar16 = &partialBlockCopy.prefilled_count;
  for (lVar13 = 0xe; lVar13 != 0; lVar13 = lVar13 + -1) {
    *psVar16 = *psVar15;
    psVar15 = psVar15 + (ulong)bVar25 * -2 + 1;
    psVar16 = psVar16 + (ulong)bVar25 * -2 + 1;
  }
  pCVar20 = &partialBlockCopy.m_check_block_mock;
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  function(pCVar20,__x);
  local_58._0_8_ =
       block.vtx.
       super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar5 = (element_type *)
           block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_58.m_message.px = peVar5;
  if (peVar5 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)
               &(peVar5->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      *p_Var1 = *p_Var1 + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (_Atomic_word *)
               &(peVar5->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      *p_Var1 = *p_Var1 + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = (iterator)&local_58;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_538,__l,(allocator_type *)(local_600 + 8));
  PartiallyDownloadedBlock::FillBlock
            (&partialBlock,(CBlock *)local_418,
             (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_538);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_538);
  if (local_58.m_message.px != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.m_message.px);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator=(&partialBlock.txn_available,&partialBlockCopy.txn_available);
  psVar15 = &partialBlockCopy.prefilled_count;
  psVar16 = &partialBlock.prefilled_count;
  for (lVar13 = 0xe; lVar13 != 0; lVar13 = lVar13 + -1) {
    *psVar16 = *psVar15;
    psVar15 = psVar15 + (ulong)bVar25 * -2 + 1;
    psVar16 = psVar16 + (ulong)bVar25 * -2 + 1;
  }
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  operator=(__x,pCVar20);
  if (partialBlockCopy.m_check_block_mock.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*partialBlockCopy.m_check_block_mock.super__Function_base._M_manager)
              ((_Any_data *)pCVar20,(_Any_data *)pCVar20,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&partialBlockCopy.txn_available);
  local_7d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7d0 = "";
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xc3;
  file_06.m_begin = (iterator)&local_7d8;
  msg_06.m_end = pvVar19;
  msg_06.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_7e8,
             msg_06);
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_01388f08;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (_Base_ptr)0xf4aea1;
  CTxMemPool::get((CTxMemPool *)local_558,(uint256 *)this_01);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ ==
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_5b8._0_8_ = (pointer)0x0;
  }
  else {
    local_5b8._0_8_ = SEXT48(*(_Atomic_word *)(local_558._8_8_ + 8));
  }
  local_598._0_8_ = local_618;
  local_618 = (undefined1  [8])0x6;
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)((pointer)local_5b8._0_8_ == (pointer)0x6);
  local_5f8.m_message.px._0_1_ = '\0';
  local_5f8.m_message.px._1_7_ = 0;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_890._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_890._8_8_ = "";
  local_578._0_8_ = local_5b8;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = '\0';
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013892a8;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  local_538[8] = 0;
  local_538._0_8_ = &PTR__lazy_ostream_013892a8;
  local_538._24_8_ = (__pthread_internal_list *)local_598;
  local_538._16_8_ = boost::unit_test::lazy_ostream::inst;
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x2;
  partialBlockCopy.prefilled_count = (size_t)local_578;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)(local_600 + 8),(lazy_ostream *)&local_58,1,2,REQUIRE,0xe40780,
             (size_t)local_890,0xc3,&partialBlockCopy,"SHARED_TX_OFFSET + 2",
             (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)local_538);
  boost::detail::shared_count::~shared_count(&local_5f8.m_message.pn);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_);
  }
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_7f8 = "";
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  local_808.member =
       (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
        *)&boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xc5;
  file_07.m_begin = (iterator)&local_800;
  msg_07.m_end = pvVar19;
  msg_07.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_810,
             msg_07);
  _cVar28 = 0x2d6ffb;
  BlockMerkleRoot((uint256 *)&partialBlockCopy,(CBlock *)local_418,&mutated);
  auVar27[0] = -((uchar)partialBlockCopy.txn_available.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_start ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0]);
  auVar27[1] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._1_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1]);
  auVar27[2] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._2_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2]);
  auVar27[3] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._3_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3]);
  auVar27[4] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._4_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4]);
  auVar27[5] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._5_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5]);
  auVar27[6] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._6_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6]);
  auVar27[7] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_start._7_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7]);
  auVar27[8] = -((uchar)partialBlockCopy.txn_available.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8]);
  auVar27[9] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish._1_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9]);
  auVar27[10] = -(partialBlockCopy.txn_available.
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish._2_1_ ==
                 block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10]);
  auVar27[0xb] = -(partialBlockCopy.txn_available.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._3_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb]
                  );
  auVar27[0xc] = -(partialBlockCopy.txn_available.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._4_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc]
                  );
  auVar27[0xd] = -(partialBlockCopy.txn_available.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._5_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd]
                  );
  auVar27[0xe] = -(partialBlockCopy.txn_available.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._6_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe]
                  );
  auVar27[0xf] = -(partialBlockCopy.txn_available.
                   super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish._7_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf]
                  );
  auVar26[0] = -((uchar)partialBlockCopy.txn_available.
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10])
  ;
  auVar26[1] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11])
  ;
  auVar26[2] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12])
  ;
  auVar26[3] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13])
  ;
  auVar26[4] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14])
  ;
  auVar26[5] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15])
  ;
  auVar26[6] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16])
  ;
  auVar26[7] = -(partialBlockCopy.txn_available.
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17])
  ;
  auVar26[8] = -((uchar)partialBlockCopy.prefilled_count ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18])
  ;
  auVar26[9] = -(partialBlockCopy.prefilled_count._1_1_ ==
                block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19])
  ;
  auVar26[10] = -(partialBlockCopy.prefilled_count._2_1_ ==
                 block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a]
                 );
  auVar26[0xb] = -(partialBlockCopy.prefilled_count._3_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1b]);
  auVar26[0xc] = -(partialBlockCopy.prefilled_count._4_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1c]);
  auVar26[0xd] = -(partialBlockCopy.prefilled_count._5_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1d]);
  auVar26[0xe] = -(partialBlockCopy.prefilled_count._6_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1e]);
  auVar26[0xf] = -(partialBlockCopy.prefilled_count._7_1_ ==
                  block.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x1f]);
  auVar26 = auVar26 & auVar27;
  local_58.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) != 0xffff);
  local_58.m_message.px = (element_type *)0x0;
  local_58.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xac;
  local_5f8._1_7_ = 0xe408;
  local_5f8.m_message.px._0_1_ = -0x1b;
  local_5f8.m_message.px._1_7_ = 0xe408;
  local_538[8] = 0;
  local_538._0_8_ = &PTR__lazy_ostream_01389048;
  local_538._24_8_ = (assertion_result *)(local_600 + 8);
  local_538._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_820[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_820[1] = "";
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_58,(lazy_ostream *)local_538,1,0,WARN,_cVar28,(size_t)local_820,0xc5);
  boost::detail::shared_count::~shared_count(&local_58.m_message.pn);
  local_4e8._16_11_ = SUB1611((undefined1  [16])0x0,5);
  local_4e8._0_8_ = (__pthread_internal_list *)0x0;
  local_4e8._8_3_ = 0;
  local_4e8._11_5_ = 0;
  local_4f8 = (undefined1  [16])0x0;
  local_508 = (undefined1  [16])0x0;
  local_538._32_16_ = (undefined1  [16])0x0;
  local_538._16_8_ = (__pthread_internal_list *)0x0;
  local_538._24_8_ = (__pthread_internal_list *)0x0;
  local_538._0_8_ = (_func_int **)0x0;
  local_538[8] = false;
  local_538._9_7_ = 0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(&partialBlockCopy.txn_available,&partialBlock.txn_available);
  psVar15 = &partialBlock.prefilled_count;
  psVar16 = &partialBlockCopy.prefilled_count;
  for (lVar13 = 0xe; lVar13 != 0; lVar13 = lVar13 + -1) {
    *psVar16 = *psVar15;
    psVar15 = psVar15 + (ulong)bVar25 * -2 + 1;
    psVar16 = psVar16 + (ulong)bVar25 * -2 + 1;
  }
  std::
  function<bool_(const_CBlock_&,_BlockValidationState_&,_const_Consensus::Params_&,_bool,_bool)>::
  function(&partialBlockCopy.m_check_block_mock,__x);
  local_830[0] = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_830[1] = (char *)((long)
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
                         + 0x6d);
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  local_838 = (undefined1  [8])&boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xc9;
  file_08.m_begin = (iterator)local_830;
  msg_08.m_end = pvVar19;
  msg_08.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_840,
             msg_08);
  local_558._0_8_ =
       ((block.vtx.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_558._8_8_ =
       ((block.vtx.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->
       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((element_type *)local_558._8_8_ != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = (_Atomic_word *)
               &(((element_type *)local_558._8_8_)->m_stream).
                super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      *p_Var1 = *p_Var1 + 1;
      UNLOCK();
    }
    else {
      p_Var1 = (_Atomic_word *)
               &(((element_type *)local_558._8_8_)->m_stream).
                super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      *p_Var1 = *p_Var1 + 1;
    }
  }
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_558;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)local_890,__l_00,(allocator_type *)local_598);
  _cVar28 = 0x2d71ed;
  RVar10 = PartiallyDownloadedBlock::FillBlock
                     (&partialBlock,(CBlock *)local_538,
                      (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)local_890);
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(RVar10 == READ_STATUS_OK);
  paVar2 = (assertion_result *)(local_600 + 8);
  local_5f8.m_message.px._0_1_ = '\0';
  local_5f8.m_message.px._1_7_ = 0;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_578._0_8_ = "partialBlock.FillBlock(block3, {block.vtx[0]}) == READ_STATUS_OK";
  local_578._8_8_ = (long)"partialBlock.FillBlock(block3, {block.vtx[0]}) == READ_STATUS_OK" + 0x40;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_01389048;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_850 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_848 = "";
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x0;
  local_40 = (_Base_ptr)local_578;
  boost::test_tools::tt_detail::report_assertion
            (paVar2,(lazy_ostream *)&local_58,1,0,WARN,_cVar28,(size_t)&local_850,0xc9);
  boost::detail::shared_count::~shared_count(&local_5f8.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_890);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_);
  }
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_858 = "";
  local_890._32_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  local_890._40_8_ = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xca;
  file_09.m_begin = (iterator)&local_860;
  msg_09.m_end = pvVar19;
  msg_09.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,
             (size_t)(local_890 + 0x20),msg_09);
  local_890._8_8_ = local_890._8_8_ & 0xffffffffffffff00;
  local_890._0_8_ = &PTR__lazy_ostream_01388f08;
  local_890._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_890._24_8_ = "";
  CBlockHeader::GetHash((uint256 *)local_578,&block.super_CBlockHeader);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_558,local_578);
  CBlockHeader::GetHash((uint256 *)local_5b8,(CBlockHeader *)local_538);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_598,local_5b8);
  if (local_558._8_8_ == local_598._8_8_) {
    if ((pointer)local_558._8_8_ == (pointer)0x0) {
      rVar24.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar11 = bcmp((void *)local_558._0_8_,(void *)local_598._0_8_,local_558._8_8_);
      rVar24.super_class_property<bool>.value = (class_property<bool>)(iVar11 == 0);
    }
  }
  else {
    rVar24.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_618[0] = rVar24.super_class_property<bool>.value;
  local_610.px = (element_type *)0x0;
  local_610.pn.pi_ = (sp_counted_base *)0x0;
  local_628._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_628._8_8_ = "";
  local_40 = (_Base_ptr)local_600;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5e0 = &local_630;
  local_5f8.m_message.px._0_1_ = '\0';
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xc8;
  local_5f8._1_7_ = 0x1388f;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x2;
  local_630 = (string *)local_598;
  local_600 = (undefined1  [8])local_558;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_618,(lazy_ostream *)local_890,1,2,REQUIRE,0xe40927,
             (size_t)local_628,0xca,(lazy_ostream *)&local_58,"block3.GetHash().ToString()",paVar2);
  boost::detail::shared_count::~shared_count(&local_610.pn);
  if ((pointer)local_598._0_8_ != (pointer)local_588) {
    operator_delete((void *)local_598._0_8_,local_588._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._0_8_ != &aStack_548) {
    operator_delete((void *)local_558._0_8_,aStack_548._M_allocated_capacity + 1);
  }
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_898 = "";
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xcb;
  file_10.m_begin = (iterator)&local_8a0;
  msg_10.m_end = pvVar19;
  msg_10.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_8b0,
             msg_10);
  local_890._8_8_ = local_890._8_8_ & 0xffffffffffffff00;
  local_890._0_8_ = &PTR__lazy_ostream_01388f08;
  local_890._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_890._24_8_ = "";
  base_blob<256u>::ToString_abi_cxx11_((string *)local_558,&block.super_CBlockHeader.hashMerkleRoot)
  ;
  BlockMerkleRoot((uint256 *)local_598,(CBlock *)local_538,&mutated);
  base_blob<256u>::ToString_abi_cxx11_((string *)local_578,local_598);
  if (local_558._8_8_ == local_578._8_8_) {
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_558._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      bVar9 = true;
    }
    else {
      iVar11 = bcmp((void *)local_558._0_8_,(void *)local_578._0_8_,local_558._8_8_);
      bVar9 = iVar11 == 0;
    }
  }
  else {
    bVar9 = false;
  }
  local_5b8[0] = bVar9;
  local_5b8._8_8_ = (element_type *)0x0;
  asStack_5a8[0].pi_ = (sp_counted_base *)0x0;
  local_618 = (undefined1  [8])0xe406e3;
  local_610.px = (element_type *)0xe40750;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_01388fc8;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (_Base_ptr)local_628;
  local_5f8.m_message.px._0_1_ = '\0';
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xc8;
  local_5f8._1_7_ = 0x1388f;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5e0 = (string **)local_600;
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x2;
  local_628._0_8_ = (string *)local_558;
  local_600 = (undefined1  [8])local_578;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_5b8,(lazy_ostream *)local_890,1,2,REQUIRE,0xe4095e,
             (size_t)local_618,0xcb,(lazy_ostream *)&local_58,
             "BlockMerkleRoot(block3, &mutated).ToString()",paVar2);
  boost::detail::shared_count::~shared_count(asStack_5a8);
  if ((element_type *)local_578._0_8_ != (element_type *)local_568) {
    operator_delete((void *)local_578._0_8_,local_568._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._0_8_ != &aStack_548) {
    operator_delete((void *)local_558._0_8_,aStack_548._M_allocated_capacity + 1);
  }
  local_8c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_8b8 = "";
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar28 = 0x2d773b;
  file_11.m_end = (iterator)0xcc;
  file_11.m_begin = (iterator)&local_8c0;
  msg_11.m_end = pvVar19;
  msg_11.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_8d0,
             msg_11);
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(mutated ^ 1);
  paVar2 = (assertion_result *)(local_600 + 8);
  local_5f8.m_message.px._0_1_ = '\0';
  local_5f8.m_message.px._1_7_ = 0;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_890._0_8_ = "!mutated";
  local_890._8_8_ = "";
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_01389048;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_8e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_8d8 = "";
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x0;
  local_40 = (_Base_ptr)local_890;
  boost::test_tools::tt_detail::report_assertion
            (paVar2,(lazy_ostream *)&local_58,1,0,WARN,_cVar28,(size_t)&local_8e0,0xcc);
  boost::detail::shared_count::~shared_count(&local_5f8.m_message.pn);
  local_8f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_8e8 = "";
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xce;
  file_12.m_begin = (iterator)&local_8f0;
  msg_12.m_end = pvVar19;
  msg_12.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_900,
             msg_12);
  local_890._8_8_ = local_890._8_8_ & 0xffffffffffffff00;
  local_890._0_8_ = &PTR__lazy_ostream_01388f08;
  local_890._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_890._24_8_ = "";
  CTxMemPool::get((CTxMemPool *)local_598,(uint256 *)this_01);
  if ((pointer)local_598._8_8_ == (pointer)0x0) {
    local_628._0_8_ = 0;
  }
  else {
    local_628._0_8_ =
         SEXT48(*(int *)&(((CScript *)(local_598._8_8_ + 8))->super_CScriptBase)._union);
  }
  local_600 = (undefined1  [8])0x7;
  local_558[0] = local_628._0_8_ == 7;
  local_558._8_8_ = (element_type *)0x0;
  aStack_548._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_578._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_578._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
       + 0x6d;
  local_5b8._0_8_ = local_628;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013892a8;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (_Base_ptr)local_5b8;
  local_618 = (undefined1  [8])local_600;
  local_5f8.m_message.px._0_1_ = '\0';
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xa8;
  local_5f8._1_7_ = 0x13892;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5e0 = (string **)local_618;
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_558,(lazy_ostream *)local_890,1,2,REQUIRE,0xe40780,
             (size_t)local_578,0xce,(lazy_ostream *)&local_58,"SHARED_TX_OFFSET + 3",paVar2);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_548._M_allocated_capacity);
  if ((pointer)local_598._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_);
  }
  peVar3 = block.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start[2].
           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  txhash.super_base_blob<256U>.m_data._M_elems._0_16_ =
       *(undefined1 (*) [16])(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
  txhash.super_base_blob<256U>.m_data._M_elems._16_16_ =
       *(undefined1 (*) [16])
        ((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
  psVar21 = block.vtx.
            super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (block.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      block.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      p_Var4 = (psVar21->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      psVar21 = psVar21 + 1;
    } while (psVar21 !=
             block.vtx.
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    block.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         block.vtx.
         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  uVar8 = local_3c8._0_8_;
  p_Var7 = (_Base_ptr)CONCAT53(local_3c8._11_5_,local_3c8._8_3_);
  p_Var22 = (_Base_ptr)local_3c8._0_8_;
  if (p_Var7 != (_Base_ptr)local_3c8._0_8_) {
    do {
      if (p_Var22->_M_parent != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var22->_M_parent);
      }
      p_Var22 = (_Base_ptr)&p_Var22->_M_left;
    } while (p_Var22 != p_Var7);
    local_3c8._8_3_ = (undefined3)uVar8;
    local_3c8._11_5_ = SUB85(uVar8,3);
  }
  uVar8 = local_4e8._0_8_;
  p_Var6 = (__pthread_internal_list *)CONCAT53(local_4e8._11_5_,local_4e8._8_3_);
  p_Var23 = (__pthread_internal_list *)local_4e8._0_8_;
  if (p_Var6 != (__pthread_internal_list *)local_4e8._0_8_) {
    do {
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var23->__next !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var23->__next);
      }
      p_Var23 = p_Var23 + 1;
    } while (p_Var23 != p_Var6);
    local_4e8._8_3_ = (undefined3)uVar8;
    local_4e8._11_5_ = SUB85(uVar8,3);
  }
  local_910 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_908 = "";
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xd4;
  file_13.m_begin = (iterator)&local_910;
  msg_13.m_end = pvVar19;
  msg_13.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_920,
             msg_13);
  local_890._8_8_ = local_890._8_8_ & 0xffffffffffffff00;
  local_890._0_8_ = &PTR__lazy_ostream_01388f08;
  local_890._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_890._24_8_ = "";
  CTxMemPool::get((CTxMemPool *)local_598,(uint256 *)this_01);
  if ((pointer)local_598._8_8_ == (pointer)0x0) {
    local_628._0_8_ = 0;
  }
  else {
    local_628._0_8_ =
         SEXT48(*(int *)&(((CScript *)(local_598._8_8_ + 8))->super_CScriptBase)._union);
  }
  local_600 = (undefined1  [8])0x4;
  local_558[0] = local_628._0_8_ == 4;
  local_558._8_8_ = (element_type *)0x0;
  aStack_548._M_allocated_capacity = (size_type)(sp_counted_base *)0x0;
  local_578._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_578._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
       + 0x6d;
  local_5b8._0_8_ = local_628;
  local_58.m_message.px = (element_type *)(local_58.m_message._1_8_ << 8);
  local_58._0_8_ = &PTR__lazy_ostream_013892a8;
  local_58.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = (_Base_ptr)local_5b8;
  local_618 = (undefined1  [8])local_600;
  local_5f8.m_message.px._0_1_ = '\0';
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0xa8;
  local_5f8._1_7_ = 0x13892;
  local_5f8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5e0 = (string **)local_618;
  pvVar18 = (iterator)0x1;
  pvVar19 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_558,(lazy_ostream *)local_890,1,2,REQUIRE,0xe40a5a,
             (size_t)local_578,0xd4,(lazy_ostream *)&local_58,"SHARED_TX_OFFSET + 1 - 1",paVar2);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_548._M_allocated_capacity);
  if ((pointer)local_598._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_598._8_8_);
  }
  if (partialBlockCopy.m_check_block_mock.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*partialBlockCopy.m_check_block_mock.super__Function_base._M_manager)
              ((_Any_data *)&partialBlockCopy.m_check_block_mock,
               (_Any_data *)&partialBlockCopy.m_check_block_mock,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&partialBlockCopy.txn_available);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_4e8);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_3c8);
  if (partialBlock.m_check_block_mock.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*partialBlock.m_check_block_mock.super__Function_base._M_manager)
              ((_Any_data *)__x,(_Any_data *)__x,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&partialBlock.txn_available);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::~vector
            (&shortIDs2.prefilledtxn);
  if (shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shortIDs2.shorttxids.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shortIDs2.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)shortIDs2.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_6b8);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::~vector
            (&shortIDs.prefilledtxn);
  if (shortIDs.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shortIDs.shorttxids.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shortIDs.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)shortIDs.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_930 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_928 = "";
  local_940 = &boost::unit_test::basic_cstring<char_const>::null;
  local_938 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xd6;
  file_14.m_begin = (iterator)&local_930;
  msg_14.m_end = pvVar19;
  msg_14.m_begin = pvVar18;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_940,
             msg_14);
  shortIDs2.shorttxidk1._0_1_ = 0;
  shortIDs2.shorttxidk0 = (uint64_t)&PTR__lazy_ostream_01388f08;
  shortIDs2.nonce = (uint64_t)boost::unit_test::lazy_ostream::inst;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf4aea1;
  CTxMemPool::get((CTxMemPool *)local_538,(uint256 *)this_01);
  if ((pointer)local_538._8_8_ == (pointer)0x0) {
    lVar13 = 0;
  }
  else {
    lVar13 = (long)*(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_538._8_8_ + 8))->
                            _M_pi;
  }
  local_6b8._0_8_ = lVar13;
  local_890._0_8_ = (pointer)0x3;
  shortIDs.header.nVersion._0_1_ = lVar13 == 3;
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_418[0] = (class_property<bool>)0xe3;
  local_418._1_7_ = 0xe406;
  local_418[8] = 0x50;
  local_418._9_7_ = 0xe407;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0xa8;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start._1_7_ = 0x13892;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0x38;
  partialBlock.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0x139d1;
  local_5f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       SUB81((lazy_ostream *)local_890,0);
  local_5f8._1_7_ = SUB87((ulong)local_890 >> 8,0);
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_013892a8;
  partialBlockCopy.txn_available.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst
  ;
  partialBlockCopy.prefilled_count = (size_t)(local_600 + 8);
  partialBlock.prefilled_count = (size_t)&local_58;
  local_58._0_8_ = (element_type *)local_6b8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&shortIDs,(lazy_ostream *)&shortIDs2,1,2,REQUIRE,0xe40a5a,
             (size_t)local_418,0xd6,&partialBlock,"SHARED_TX_OFFSET - 1",&partialBlockCopy);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             (shortIDs.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems + 0xc));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_538._8_8_);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock2.super_unique_lock);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock1.super_unique_lock);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&block.vtx);
  ChaCha20::~ChaCha20(&rand_ctx.rng);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(NonCoinbasePreforwardRTTest)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    TestMemPoolEntryHelper entry;
    auto rand_ctx(FastRandomContext(uint256{42}));
    CBlock block(BuildBlockTestCase(rand_ctx));

    LOCK2(cs_main, pool.cs);
    pool.addUnchecked(entry.FromTx(block.vtx[2]));
    BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 0);

    uint256 txhash;

    // Test with pre-forwarding tx 1, but not coinbase
    {
        TestHeaderAndShortIDs shortIDs(block, rand_ctx);
        shortIDs.prefilledtxn.resize(1);
        shortIDs.prefilledtxn[0] = {1, block.vtx[1]};
        shortIDs.shorttxids.resize(2);
        shortIDs.shorttxids[0] = shortIDs.GetShortID(block.vtx[0]->GetWitnessHash());
        shortIDs.shorttxids[1] = shortIDs.GetShortID(block.vtx[2]->GetWitnessHash());

        DataStream stream{};
        stream << shortIDs;

        CBlockHeaderAndShortTxIDs shortIDs2;
        stream >> shortIDs2;

        PartiallyDownloadedBlock partialBlock(&pool);
        BOOST_CHECK(partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK);
        BOOST_CHECK(!partialBlock.IsTxAvailable(0));
        BOOST_CHECK( partialBlock.IsTxAvailable(1));
        BOOST_CHECK( partialBlock.IsTxAvailable(2));

        BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 1); // +1 because of partialBlock

        CBlock block2;
        {
            PartiallyDownloadedBlock tmp = partialBlock;
            BOOST_CHECK(partialBlock.FillBlock(block2, {}) == READ_STATUS_INVALID); // No transactions
            partialBlock = tmp;
        }

        // Wrong transaction
        {
            PartiallyDownloadedBlock tmp = partialBlock;
            partialBlock.FillBlock(block2, {block.vtx[1]}); // Current implementation doesn't check txn here, but don't require that
            partialBlock = tmp;
        }
        BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 2); // +2 because of partialBlock and block2
        bool mutated;
        BOOST_CHECK(block.hashMerkleRoot != BlockMerkleRoot(block2, &mutated));

        CBlock block3;
        PartiallyDownloadedBlock partialBlockCopy = partialBlock;
        BOOST_CHECK(partialBlock.FillBlock(block3, {block.vtx[0]}) == READ_STATUS_OK);
        BOOST_CHECK_EQUAL(block.GetHash().ToString(), block3.GetHash().ToString());
        BOOST_CHECK_EQUAL(block.hashMerkleRoot.ToString(), BlockMerkleRoot(block3, &mutated).ToString());
        BOOST_CHECK(!mutated);

        BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 3); // +2 because of partialBlock and block2 and block3

        txhash = block.vtx[2]->GetHash();
        block.vtx.clear();
        block2.vtx.clear();
        block3.vtx.clear();
        BOOST_CHECK_EQUAL(pool.get(txhash).use_count(), SHARED_TX_OFFSET + 1 - 1); // + 1 because of partialBlock; -1 because of block.
    }
    BOOST_CHECK_EQUAL(pool.get(txhash).use_count(), SHARED_TX_OFFSET - 1); // -1 because of block
}